

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O0

bool __thiscall cmParseMumpsCoverage::LoadPackages(cmParseMumpsCoverage *this,string *d)

{
  undefined8 uVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long lVar3;
  mapped_type *this_01;
  undefined1 local_140 [8];
  string name;
  string *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmAlphaNum local_d0;
  undefined1 local_a0 [8];
  string pat;
  undefined1 local_70 [8];
  Glob glob;
  string *d_local;
  cmParseMumpsCoverage *this_local;
  
  glob._80_8_ = d;
  cmsys::Glob::Glob((Glob *)local_70);
  cmsys::Glob::RecurseOn((Glob *)local_70);
  cmAlphaNum::cmAlphaNum(&local_d0,(string *)glob._80_8_);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range1,"/*.m");
  cmStrCat<>((string *)local_a0,&local_d0,(cmAlphaNum *)&__range1);
  cmsys::Glob::FindFiles((Glob *)local_70,(string *)local_a0,(GlobMessages *)0x0);
  this_00 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_70);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  file = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&file);
    if (!bVar2) break;
    name.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    cmsys::SystemTools::GetFilenameName((string *)local_140,(string *)name.field_2._8_8_);
    lVar3 = std::__cxx11::string::size();
    std::__cxx11::string::erase((ulong)local_140,lVar3 - 2);
    uVar1 = name.field_2._8_8_;
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->RoutineToDirectory,(key_type *)local_140);
    std::__cxx11::string::operator=((string *)this_01,(string *)uVar1);
    InitializeMumpsFile(this,(string *)name.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_140);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_a0);
  cmsys::Glob::~Glob((Glob *)local_70);
  return true;
}

Assistant:

bool cmParseMumpsCoverage::LoadPackages(std::string const& d)
{
  cmsys::Glob glob;
  glob.RecurseOn();
  std::string pat = cmStrCat(d, "/*.m");
  glob.FindFiles(pat);
  for (std::string& file : glob.GetFiles()) {
    std::string name = cmSystemTools::GetFilenameName(file);
    name.erase(name.size() - 2);
    this->RoutineToDirectory[name] = file;
    // initialize each file, this is left out until CDash is fixed
    // to handle large numbers of files
    this->InitializeMumpsFile(file);
  }
  return true;
}